

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O1

void Assimp::STEP::ReadFile
               (DB *db,ConversionSchema *scheme,char **types_to_track,size_t len,
               char **inverse_indices_to_track,size_t len2)

{
  char cVar1;
  StreamReaderLE *pSVar2;
  pointer pcVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  ulong uVar7;
  size_type sVar8;
  Logger *pLVar9;
  ulong uVar10;
  _Rb_tree_header *p_Var11;
  ulong uVar12;
  const_iterator cVar13;
  char *args;
  LazyObject *this;
  ulong uVar14;
  uint *max_inout;
  _Rb_tree_header *p_Var15;
  ulong extraout_RDX;
  _Alloc_hider _Var16;
  char cVar17;
  uint64_t line;
  char *type_00;
  long lVar18;
  bool bVar19;
  bool bVar20;
  string s;
  string type;
  string local_268;
  string local_248;
  LineSplitter *local_228;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  ulong local_218;
  long local_210 [2];
  ulong local_200;
  uint64_t local_1f8;
  _Rb_tree_header *local_1f0;
  int local_1e4;
  string local_1e0;
  string local_1c0 [3];
  ios_base local_150 [264];
  Logger *local_48;
  _Base_ptr local_40;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
  *local_38;
  
  db->schema = scheme;
  DB::SetTypesToTrack(db,types_to_track,len);
  DB::SetInverseIndicesToTrack(db,inverse_indices_to_track,len2);
  local_228 = &db->splitter;
  local_1f0 = &(db->objects)._M_t._M_impl.super__Rb_tree_header;
  local_40 = &(scheme->converters)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_38 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
              *)scheme;
  do {
    pSVar2 = (db->splitter).mStream;
    if (*(int *)&pSVar2->end == *(int *)&pSVar2->current) break;
    local_220._M_current = (char *)local_210;
    pcVar3 = (db->splitter).mCur._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_220,pcVar3,pcVar3 + (db->splitter).mCur._M_string_length);
    local_1e4 = std::__cxx11::string::compare((char *)&local_220);
    if (local_1e4 != 0) {
      local_1c0[0]._M_dataplus._M_p._0_1_ = 0x20;
      _Var6 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (local_220,local_220._M_current + local_218,
                         (_Iter_equals_val<const_char>)local_1c0);
      local_218 = (long)_Var6._M_current - (long)local_220._M_current;
      *_Var6._M_current = '\0';
      if (local_218 == 0) goto LAB_0069d3e7;
      line = local_228->mIdx + 1;
      if (*local_220._M_current == '#') {
        uVar7 = std::__cxx11::string::find((char)&local_220,0x3d);
        if (uVar7 == 0xffffffffffffffff) {
          pLVar9 = DefaultLogger::get();
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_268,"expected token \'=\'","");
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
          AddLineNumber(local_1c0,&local_268,line,&local_248);
          Logger::warn(pLVar9,local_1c0[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0[0]._M_dataplus._M_p != &local_1c0[0].field_2) {
            operator_delete(local_1c0[0]._M_dataplus._M_p,
                            local_1c0[0].field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          LineSplitter::operator++(local_228);
        }
        else {
          max_inout = (uint *)(uVar7 - 1);
          std::__cxx11::string::substr((ulong)local_1c0,(ulong)&local_220);
          local_1f8 = strtoul10_64((Assimp *)local_1c0[0]._M_dataplus._M_p,(char *)0x0,(char **)0x0,
                                   max_inout);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0[0]._M_dataplus._M_p != &local_1c0[0].field_2) {
            operator_delete(local_1c0[0]._M_dataplus._M_p,
                            local_1c0[0].field_2._M_allocated_capacity + 1);
          }
          if (local_1f8 == 0) {
            pLVar9 = DefaultLogger::get();
            local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_268,"expected positive, numeric entity id","");
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
            AddLineNumber(local_1c0,&local_268,line,&local_248);
            Logger::warn(pLVar9,local_1c0[0]._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0[0]._M_dataplus._M_p != &local_1c0[0].field_2) {
              operator_delete(local_1c0[0]._M_dataplus._M_p,
                              local_1c0[0].field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
            LineSplitter::operator++(local_228);
          }
          else {
            local_200 = std::__cxx11::string::find((char)&local_220,0x28);
            bVar19 = local_200 == 0xffffffffffffffff;
            if (bVar19) {
              LineSplitter::operator++(local_228);
              local_200 = 0xffffffffffffffff;
              bVar20 = false;
              while (pSVar2 = (db->splitter).mStream,
                    *(int *)&pSVar2->end != *(int *)&pSVar2->current) {
                local_1c0[0]._M_dataplus._M_p = (pointer)&local_1c0[0].field_2;
                pcVar3 = (db->splitter).mCur._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1c0,pcVar3,pcVar3 + (db->splitter).mCur._M_string_length)
                ;
                if (local_1c0[0]._M_string_length != 0) {
                  if (*local_1c0[0]._M_dataplus._M_p == '#') {
                    sVar8 = 1;
                    do {
                      if (local_1c0[0]._M_string_length == sVar8) break;
                      cVar1 = local_1c0[0]._M_dataplus._M_p[sVar8];
                      if (cVar1 == '=') {
                        bVar5 = true;
                        goto LAB_0069c923;
                      }
                      sVar8 = sVar8 + 1;
                    } while (cVar1 == ' ' || (byte)(cVar1 - 0x30U) < 10);
                  }
                  std::__cxx11::string::_M_append
                            ((char *)&local_220,(ulong)local_1c0[0]._M_dataplus._M_p);
                  local_200 = std::__cxx11::string::find((char)&local_220,0x28);
                  bVar20 = local_200 != 0xffffffffffffffff;
                }
                bVar5 = false;
LAB_0069c923:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0[0]._M_dataplus._M_p != &local_1c0[0].field_2) {
                  operator_delete(local_1c0[0]._M_dataplus._M_p,
                                  local_1c0[0].field_2._M_allocated_capacity + 1);
                }
                if (bVar5) break;
                LineSplitter::operator++(local_228);
              }
              if (!bVar20) {
                pLVar9 = DefaultLogger::get();
                local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_268,"expected token \'(\'","");
                local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
                AddLineNumber(local_1c0,&local_268,line,&local_248);
                Logger::warn(pLVar9,local_1c0[0]._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0[0]._M_dataplus._M_p != &local_1c0[0].field_2) {
                  operator_delete(local_1c0[0]._M_dataplus._M_p,
                                  local_1c0[0].field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p,
                                  local_248.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_dataplus._M_p != &local_268.field_2) {
                  operator_delete(local_268._M_dataplus._M_p,
                                  local_268.field_2._M_allocated_capacity + 1);
                }
                if (!bVar20) goto LAB_0069d272;
              }
            }
            uVar10 = std::__cxx11::string::rfind((char)&local_220,0x29);
            if ((((uVar10 == 0xffffffffffffffff) || (uVar10 < local_200)) ||
                (uVar10 == local_218 - 1)) || (local_220._M_current[uVar10 + 1] != ';')) {
              LineSplitter::operator++(local_228);
              bVar20 = false;
              while (pSVar2 = (db->splitter).mStream,
                    *(int *)&pSVar2->end != *(int *)&pSVar2->current) {
                local_1c0[0]._M_dataplus._M_p = (pointer)&local_1c0[0].field_2;
                pcVar3 = (db->splitter).mCur._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1c0,pcVar3,pcVar3 + (db->splitter).mCur._M_string_length)
                ;
                if (local_1c0[0]._M_string_length != 0) {
                  if (*local_1c0[0]._M_dataplus._M_p == '#') {
                    sVar8 = 1;
                    do {
                      if (local_1c0[0]._M_string_length == sVar8) break;
                      cVar1 = local_1c0[0]._M_dataplus._M_p[sVar8];
                      if (cVar1 == '=') {
                        bVar19 = true;
                        goto LAB_0069ce1d;
                      }
                      sVar8 = sVar8 + 1;
                    } while (cVar1 == ' ' || (byte)(cVar1 - 0x30U) < 10);
                  }
                  std::__cxx11::string::_M_append
                            ((char *)&local_220,(ulong)local_1c0[0]._M_dataplus._M_p);
                  uVar10 = std::__cxx11::string::rfind((char)&local_220,0x29);
                  bVar20 = false;
                  if (((uVar10 != 0xffffffffffffffff) && (bVar20 = false, local_200 <= uVar10)) &&
                     (bVar20 = false, uVar10 != local_218 - 1)) {
                    bVar20 = local_220._M_current[uVar10 + 1] == ';';
                  }
                }
                bVar19 = false;
LAB_0069ce1d:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0[0]._M_dataplus._M_p != &local_1c0[0].field_2) {
                  operator_delete(local_1c0[0]._M_dataplus._M_p,
                                  local_1c0[0].field_2._M_allocated_capacity + 1);
                }
                if (bVar19) break;
                LineSplitter::operator++(local_228);
              }
              bVar19 = true;
              if (!bVar20) {
                local_48 = DefaultLogger::get();
                local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_268,"expected token \')\'","");
                local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
                AddLineNumber(local_1c0,&local_268,line,&local_248);
                Logger::warn(local_48,local_1c0[0]._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0[0]._M_dataplus._M_p != &local_1c0[0].field_2) {
                  operator_delete(local_1c0[0]._M_dataplus._M_p,
                                  local_1c0[0].field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p,
                                  local_248.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_dataplus._M_p != &local_268.field_2) {
                  operator_delete(local_268._M_dataplus._M_p,
                                  local_268.field_2._M_allocated_capacity + 1);
                }
                if (!bVar20) goto LAB_0069d272;
              }
            }
            p_Var11 = local_1f0;
            for (p_Var4 = (db->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
                p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < local_1f8]) {
              if (*(ulong *)(p_Var4 + 1) >= local_1f8) {
                p_Var11 = (_Rb_tree_header *)p_Var4;
              }
            }
            p_Var15 = local_1f0;
            if ((p_Var11 != local_1f0) && (p_Var15 = p_Var11, local_1f8 < p_Var11->_M_node_count)) {
              p_Var15 = local_1f0;
            }
            if (p_Var15 != local_1f0) {
              pLVar9 = DefaultLogger::get();
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c0,"an object with the id #",0x17);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c0," already exists",0xf);
              std::__cxx11::stringbuf::str();
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"");
              AddLineNumber(&local_268,&local_248,line,&local_1e0);
              Logger::warn(pLVar9,local_268._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._M_dataplus._M_p != &local_268.field_2) {
                operator_delete(local_268._M_dataplus._M_p,
                                local_268.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
              std::ios_base::~ios_base(local_150);
            }
            uVar12 = uVar7 + 1;
            uVar14 = uVar12;
            if (local_218 <= uVar12) {
LAB_0069d3d6:
              std::__throw_out_of_range_fmt
                        ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                         uVar14);
LAB_0069d3e7:
              __assert_fail("s.length()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/STEPParser/STEPFileReader.cpp"
                            ,0xc0,
                            "void Assimp::STEP::ReadFile(DB &, const EXPRESS::ConversionSchema &, const char *const *, size_t, const char *const *, size_t)"
                           );
            }
            _Var16._M_p = (pointer)(~uVar7 + local_200);
            while ((local_220._M_current[uVar12] == ' ' ||
                   (uVar7 = local_200, local_220._M_current[uVar12] == '\t'))) {
              uVar12 = uVar12 + 1;
              _Var16._M_p = _Var16._M_p + -1;
              uVar14 = local_218;
              if (uVar12 == local_218) goto LAB_0069d3d6;
            }
            while( true ) {
              uVar7 = uVar7 - 1;
              if (local_218 <= uVar7) {
                std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
                uVar14 = extraout_RDX;
                goto LAB_0069d3d6;
              }
              if ((local_220._M_current[uVar7] != ' ') && (local_220._M_current[uVar7] != '\t'))
              break;
              _Var16._M_p = _Var16._M_p + -1;
            }
            std::__cxx11::string::substr((ulong)local_1c0,(ulong)&local_220);
            if (local_1c0[0]._M_string_length != 0) {
              sVar8 = 0;
              do {
                cVar1 = local_1c0[0]._M_dataplus._M_p[sVar8];
                cVar17 = cVar1 + ' ';
                if (0x19 < (byte)(cVar1 + 0xbfU)) {
                  cVar17 = cVar1;
                }
                local_1c0[0]._M_dataplus._M_p[sVar8] = cVar17;
                sVar8 = sVar8 + 1;
                _Var16._M_p = local_1c0[0]._M_dataplus._M_p;
              } while (local_1c0[0]._M_string_length != sVar8);
            }
            cVar13 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
                     ::find(local_38,local_1c0);
            if (cVar13._M_node == local_40) {
              type_00 = (char *)0x0;
            }
            else {
              type_00 = *(char **)(cVar13._M_node + 1);
            }
            if (type_00 != (char *)0x0) {
              lVar18 = uVar10 - local_200;
              args = (char *)operator_new__(lVar18 + 2);
              if (local_220._M_current + ((uVar10 + 1) - (long)(local_220._M_current + local_200))
                  != (char *)0x0) {
                memmove(args,local_220._M_current + local_200,
                        (size_t)(local_220._M_current +
                                ((uVar10 + 1) - (long)(local_220._M_current + local_200))));
              }
              args[lVar18 + 1] = '\0';
              this = (LazyObject *)operator_new(0x28);
              LazyObject::LazyObject(this,db,local_1f8,(uint64_t)_Var16._M_p,type_00,args);
              DB::InternInsert(db,this);
            }
            if (!bVar19) {
              LineSplitter::operator++(local_228);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0[0]._M_dataplus._M_p != &local_1c0[0].field_2) {
              operator_delete(local_1c0[0]._M_dataplus._M_p,
                              local_1c0[0].field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      else {
        pLVar9 = DefaultLogger::get();
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"expected token \'#\'","");
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
        AddLineNumber(local_1c0,&local_268,line,&local_248);
        Logger::warn(pLVar9,local_1c0[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0[0]._M_dataplus._M_p != &local_1c0[0].field_2) {
          operator_delete(local_1c0[0]._M_dataplus._M_p,
                          local_1c0[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        LineSplitter::operator++(local_228);
      }
    }
LAB_0069d272:
    if ((long *)local_220._M_current != local_210) {
      operator_delete(local_220._M_current,local_210[0] + 1);
    }
  } while (local_1e4 != 0);
  pSVar2 = (db->splitter).mStream;
  if (*(int *)&pSVar2->end == *(int *)&pSVar2->current) {
    pLVar9 = DefaultLogger::get();
    Logger::warn(pLVar9,"STEP: ignoring unexpected EOF");
  }
  bVar19 = DefaultLogger::isNullLogger();
  if (!bVar19) {
    pLVar9 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"STEP: got ",10);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0," object records with ",0x15);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0," inverse index entries",0x16);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar9,local_220._M_current);
    if ((long *)local_220._M_current != local_210) {
      operator_delete(local_220._M_current,local_210[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base(local_150);
  }
  return;
}

Assistant:

void STEP::ReadFile(DB& db,const EXPRESS::ConversionSchema& scheme,
    const char* const* types_to_track, size_t len,
    const char* const* inverse_indices_to_track, size_t len2)
{
    db.SetSchema(scheme);
    db.SetTypesToTrack(types_to_track,len);
    db.SetInverseIndicesToTrack(inverse_indices_to_track,len2);

    const DB::ObjectMap& map = db.GetObjects();
    LineSplitter& splitter = db.GetSplitter();

    while (splitter) {
        bool has_next = false;
        std::string s = *splitter;
        if (s == "ENDSEC;") {
            break;
        }
        s.erase(std::remove(s.begin(), s.end(), ' '), s.end());

        // want one-based line numbers for human readers, so +1
        const uint64_t line = splitter.get_index()+1;
        // LineSplitter already ignores empty lines
        ai_assert(s.length());
        if (s[0] != '#') {
            ASSIMP_LOG_WARN(AddLineNumber("expected token \'#\'",line));
            ++splitter;
            continue;
        }
        // ---
        // extract id, entity class name and argument string,
        // but don't create the actual object yet.
        // ---
        const std::string::size_type n0 = s.find_first_of('=');
        if (n0 == std::string::npos) {
            ASSIMP_LOG_WARN(AddLineNumber("expected token \'=\'",line));
            ++splitter;
            continue;
        }

        const uint64_t id = strtoul10_64(s.substr(1,n0-1).c_str());
        if (!id) {
            ASSIMP_LOG_WARN(AddLineNumber("expected positive, numeric entity id",line));
            ++splitter;
            continue;
        }
        std::string::size_type n1 = s.find_first_of('(',n0);
        if (n1 == std::string::npos) {
            has_next = true;
            bool ok = false;
            for( ++splitter; splitter; ++splitter) {
                const std::string& snext = *splitter;
                if (snext.empty()) {
                    continue;
                }

                // the next line doesn't start an entity, so maybe it is
                // just a continuation  for this line, keep going
                if (!IsEntityDef(snext)) {
                    s.append(snext);
                    n1 = s.find_first_of('(',n0);
                    ok = (n1 != std::string::npos);
                }
                else {
                    break;
                }
            }

            if(!ok) {
                ASSIMP_LOG_WARN(AddLineNumber("expected token \'(\'",line));
                continue;
            }
        }

        std::string::size_type n2 = s.find_last_of(')');
        if (n2 == std::string::npos || n2 < n1 || n2 == s.length() - 1 || s[n2 + 1] != ';') {
            has_next = true;
            bool ok = false;
            for( ++splitter; splitter; ++splitter) {
                const std::string& snext = *splitter;
                if (snext.empty()) {
                    continue;
                }

                // the next line doesn't start an entity, so maybe it is
                // just a continuation  for this line, keep going
                if (!IsEntityDef(snext)) {
                    s.append(snext);
                    n2 = s.find_last_of(')');
                    ok = !(n2 == std::string::npos || n2 < n1 || n2 == s.length() - 1 || s[n2 + 1] != ';');
                } else {
                    break;
                }
            }
            if(!ok) {
                ASSIMP_LOG_WARN(AddLineNumber("expected token \')\'",line));
                continue;
            }
        }

        if (map.find(id) != map.end()) {
            ASSIMP_LOG_WARN(AddLineNumber((Formatter::format(),"an object with the id #",id," already exists"),line));
        }

        std::string::size_type ns = n0;
        do ++ns; while( IsSpace(s.at(ns)));
        std::string::size_type ne = n1;
        do --ne; while( IsSpace(s.at(ne)));
        std::string type = s.substr(ns,ne-ns+1);
        std::transform( type.begin(), type.end(), type.begin(), &Assimp::ToLower<char>  );
        const char* sz = scheme.GetStaticStringForToken(type);
        if(sz) {
            const std::string::size_type szLen = n2-n1+1;
            char* const copysz = new char[szLen+1];
            std::copy(s.c_str()+n1,s.c_str()+n2+1,copysz);
            copysz[szLen] = '\0';
            db.InternInsert(new LazyObject(db,id,line,sz,copysz));
        }
        if(!has_next) {
            ++splitter;
        }
    }

    if (!splitter) {
        ASSIMP_LOG_WARN("STEP: ignoring unexpected EOF");
    }

    if ( !DefaultLogger::isNullLogger()){
        ASSIMP_LOG_DEBUG((Formatter::format(),"STEP: got ",map.size()," object records with ",
            db.GetRefs().size()," inverse index entries"));
    }
}